

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixflowtbb.cpp
# Opt level: O0

void __thiscall
TPZStructMatrixTBBFlow<std::complex<double>_>::Assemble
          (TPZStructMatrixTBBFlow<std::complex<double>_> *this,TPZBaseMatrix *stiffness,
          TPZBaseMatrix *rhs,TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  bool bVar1;
  TPZEquationFilter *this_00;
  RunStatsTable *in_RDX;
  TPZAutoPointer<TPZGuiInterface> *in_RSI;
  long *in_RDI;
  TPZFMatrix<std::complex<double>_> rhsloc;
  int64_t neqcondense;
  TPZEquationFilter *equationFilter;
  TPZEquationFilter *in_stack_fffffffffffffec8;
  RunStatsTable *in_stack_fffffffffffffed0;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  TPZStructMatrix *local_f8;
  undefined1 local_e0 [8];
  int64_t in_stack_ffffffffffffff28;
  TPZBaseMatrix *in_stack_ffffffffffffff30;
  TPZFMatrix<std::complex<double>_> *in_stack_ffffffffffffff38;
  TPZEquationFilter *in_stack_ffffffffffffff40;
  
  if (in_RDI == (long *)0x0) {
    local_f8 = (TPZStructMatrix *)0x0;
  }
  else {
    local_f8 = (TPZStructMatrix *)
               __dynamic_cast(in_RDI,&TPZStructMatrixTBBFlow<std::complex<double>>::typeinfo,
                              &::TPZStructMatrix::typeinfo,0xfffffffffffffffe);
  }
  this_00 = ::TPZStructMatrix::EquationFilter(local_f8);
  RunStatsTable::start(in_stack_fffffffffffffed0);
  bVar1 = TPZEquationFilter::IsActive(this_00);
  if (bVar1) {
    TPZEquationFilter::NActiveEquations(in_stack_fffffffffffffec8);
    TPZFMatrix<std::complex<double>_>::TPZFMatrix
              ((TPZFMatrix<std::complex<double>_> *)
               CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
    bVar1 = TPZStrMatParInterface::ComputeRhs
                      ((TPZStrMatParInterface *)((long)in_RDI + *(long *)(*in_RDI + -0x60)));
    if (bVar1) {
      TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RDX);
      TPZFMatrix<std::complex<double>_>::Redim
                (in_stack_ffffffffffffff38,(int64_t)in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff28);
    }
    in_RDX = in_stack_fffffffffffffed0;
    TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer
              ((TPZAutoPointer<TPZGuiInterface> *)in_RDX,
               (TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffffec8);
    (**(code **)(*in_RDI + 0x68))(in_RDI,in_RSI,&stack0xffffffffffffff40,&stack0xffffffffffffff28);
    TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer((TPZAutoPointer<TPZGuiInterface> *)in_RDX);
    bVar1 = TPZStrMatParInterface::ComputeRhs
                      ((TPZStrMatParInterface *)((long)in_RDI + *(long *)(*in_RDI + -0x60)));
    if (bVar1) {
      TPZEquationFilter::Scatter
                (in_stack_ffffffffffffff40,(TPZBaseMatrix *)in_stack_ffffffffffffff38,
                 in_stack_ffffffffffffff30);
    }
    TPZFMatrix<std::complex<double>_>::~TPZFMatrix((TPZFMatrix<std::complex<double>_> *)0x1d8df6e);
  }
  else {
    TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer
              ((TPZAutoPointer<TPZGuiInterface> *)in_RDX,in_RSI);
    (**(code **)(*in_RDI + 0x68))(in_RDI,in_RSI,in_RDX,local_e0);
    TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer((TPZAutoPointer<TPZGuiInterface> *)in_RDX);
  }
  RunStatsTable::stop(in_RDX);
  return;
}

Assistant:

void TPZStructMatrixTBBFlow<TVar>::Assemble(TPZBaseMatrix & stiffness, TPZBaseMatrix & rhs,TPZAutoPointer<TPZGuiInterface> guiInterface){
    const auto &equationFilter =
        (dynamic_cast<TPZStructMatrix*>(this))->EquationFilter();
    ass_stiff.start();
    if (equationFilter.IsActive()) {
        int64_t neqcondense = equationFilter.NActiveEquations();
#ifdef PZDEBUG
        if (stiffness.Rows() != neqcondense) {
            DebugStop();
        }
#endif
        TPZFMatrix<TVar> rhsloc;
        if(ComputeRhs()) rhsloc.Redim(neqcondense, rhs.Cols());
        this->MultiThread_Assemble(stiffness,rhsloc,guiInterface);
        if(ComputeRhs()) equationFilter.Scatter(rhsloc, rhs);
    }
    else
    {
        this->MultiThread_Assemble(stiffness,rhs,guiInterface);
        
    }
    ass_stiff.stop();
}